

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c++
# Opt level: O2

bool __thiscall
kj::MainBuilder::Impl::OptionDisplayOrder::operator()(OptionDisplayOrder *this,Option *a,Option *b)

{
  OptionName *pOVar1;
  OptionName *pOVar2;
  char *pcVar3;
  bool bVar4;
  long lVar5;
  size_t sVar6;
  char cVar7;
  long lVar8;
  char cVar9;
  long lVar10;
  StringPtr bLong;
  StringPtr aLong;
  ArrayPtr<const_char> local_38;
  ArrayPtr<const_char> local_28;
  
  if (a == b) {
    return false;
  }
  pOVar1 = (a->names).ptr;
  lVar8 = (a->names).size_ << 4;
  cVar9 = '\0';
  for (lVar5 = 0; lVar8 != lVar5; lVar5 = lVar5 + 0x10) {
    if ((&pOVar1->isLong)[lVar5] != true) {
      cVar9 = *(char *)((long)&pOVar1->field_1 + lVar5);
      break;
    }
    if (cVar9 == '\0') {
      cVar9 = **(char **)((long)&pOVar1->field_1 + lVar5);
    }
  }
  pOVar2 = (b->names).ptr;
  lVar10 = (b->names).size_ << 4;
  cVar7 = '\0';
  for (lVar5 = 0; lVar10 != lVar5; lVar5 = lVar5 + 0x10) {
    if ((&pOVar2->isLong)[lVar5] != true) {
      cVar7 = *(char *)((long)&pOVar2->field_1 + lVar5);
      break;
    }
    if (cVar7 == '\0') {
      cVar7 = **(char **)((long)&pOVar2->field_1 + lVar5);
    }
  }
  bVar4 = true;
  if (cVar7 <= cVar9) {
    if (cVar7 < cVar9) {
      bVar4 = false;
    }
    else {
      local_28.ptr = "";
      local_28.size_ = 1;
      local_38.ptr = "";
      local_38.size_ = 1;
      for (lVar5 = 0; lVar8 != lVar5; lVar5 = lVar5 + 0x10) {
        if ((&pOVar1->isLong)[lVar5] == true) {
          pcVar3 = *(char **)((long)&pOVar1->field_1 + lVar5);
          sVar6 = strlen(pcVar3);
          local_28.size_ = sVar6 + 1;
          local_28.ptr = pcVar3;
          break;
        }
      }
      for (lVar5 = 0; lVar10 != lVar5; lVar5 = lVar5 + 0x10) {
        if ((&pOVar2->isLong)[lVar5] == true) {
          pcVar3 = *(char **)((long)&pOVar2->field_1 + lVar5);
          sVar6 = strlen(pcVar3);
          local_38.size_ = sVar6 + 1;
          local_38.ptr = pcVar3;
          break;
        }
      }
      bVar4 = ArrayPtr<const_char>::operator<(&local_28,&local_38);
    }
  }
  return bVar4;
}

Assistant:

bool operator()(const Option* a, const Option* b) const {
    if (a == b) return false;

    char aShort = '\0';
    char bShort = '\0';

    for (auto& name: a->names) {
      if (name.isLong) {
        if (aShort == '\0') {
          aShort = name.longName[0];
        }
      } else {
        aShort = name.shortName;
        break;
      }
    }
    for (auto& name: b->names) {
      if (name.isLong) {
        if (bShort == '\0') {
          bShort = name.longName[0];
        }
      } else {
        bShort = name.shortName;
        break;
      }
    }

    if (aShort < bShort) return true;
    if (aShort > bShort) return false;

    StringPtr aLong;
    StringPtr bLong;

    for (auto& name: a->names) {
      if (name.isLong) {
        aLong = name.longName;
        break;
      }
    }
    for (auto& name: b->names) {
      if (name.isLong) {
        bLong = name.longName;
        break;
      }
    }

    return aLong < bLong;
  }